

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiBufferViewAccessTests.cpp
# Opt level: O3

void __thiscall
vkt::api::anon_unknown_0::BufferViewTestInstance::~BufferViewTestInstance
          (BufferViewTestInstance *this)

{
  VkFence obj;
  long *plVar1;
  VkBuffer VVar2;
  undefined8 uVar3;
  VkCommandPool obj_00;
  VkPipeline obj_01;
  VkPipelineLayout obj_02;
  Context *pCVar4;
  void *pvVar5;
  VkShaderModule obj_03;
  VkBufferView obj_04;
  undefined8 uVar6;
  VkDescriptorPool obj_05;
  VkDescriptorSetLayout obj_06;
  VkRenderPass obj_07;
  VkImageView obj_08;
  VkImage obj_09;
  
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__BufferViewTestInstance_00d24eb0;
  obj.m_internal = (deUint64)this[0xe].super_TestInstance.m_context;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)6>_> *)&this[0xe].m_testCase,obj);
  }
  this[0xe].m_testCase.offset = 0;
  this[0xe].m_testCase.range = 0;
  this[0xe].super_TestInstance.m_context = (Context *)0x0;
  *(undefined8 *)&this[0xe].m_testCase = 0;
  plVar1 = *(long **)&this[0xd].m_testCase.usage;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
    this[0xd].m_testCase.usage = 0;
    this[0xd].m_testCase.features = 0;
  }
  VVar2.m_internal = (deUint64)this[0xd].super_TestInstance.m_context;
  if (VVar2.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)8>_> *)&this[0xd].m_testCase,VVar2);
  }
  this[0xd].m_testCase.offset = 0;
  this[0xd].m_testCase.range = 0;
  this[0xd].super_TestInstance.m_context = (Context *)0x0;
  *(undefined8 *)&this[0xd].m_testCase = 0;
  if (this[0xc].m_testCase.offset != 0) {
    plVar1 = (long *)this[0xc].m_testCase.range;
    uVar3._0_4_ = this[0xc].m_testCase.usage;
    uVar3._4_4_ = this[0xc].m_testCase.features;
    (**(code **)(*plVar1 + 0x240))(plVar1,uVar3,this[0xd].super_TestInstance._vptr_TestInstance,1);
  }
  this[0xc].m_testCase.usage = 0;
  this[0xc].m_testCase.features = 0;
  this[0xd].super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
  this[0xc].m_testCase.offset = 0;
  this[0xc].m_testCase.range = 0;
  obj_00.m_internal._0_4_ = this[0xb].m_testCase.usage;
  obj_00.m_internal._4_4_ = this[0xb].m_testCase.features;
  if (obj_00.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)24>_> *)(this + 0xc),obj_00);
  }
  this[0xc].super_TestInstance.m_context = (Context *)0x0;
  *(undefined8 *)&this[0xc].m_testCase = 0;
  this[0xb].m_testCase.usage = 0;
  this[0xb].m_testCase.features = 0;
  this[0xc].super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
  obj_01.m_internal = (deUint64)this[0xb].super_TestInstance.m_context;
  if (obj_01.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)18>_> *)&this[0xb].m_testCase,obj_01);
  }
  this[0xb].m_testCase.offset = 0;
  this[0xb].m_testCase.range = 0;
  this[0xb].super_TestInstance.m_context = (Context *)0x0;
  *(undefined8 *)&this[0xb].m_testCase = 0;
  obj_02.m_internal = this[10].m_testCase.offset;
  if (obj_02.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)16>_> *)&this[10].m_testCase.range,obj_02);
  }
  this[10].m_testCase.usage = 0;
  this[10].m_testCase.features = 0;
  this[0xb].super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
  this[10].m_testCase.offset = 0;
  this[10].m_testCase.range = 0;
  pCVar4 = this[10].super_TestInstance.m_context;
  if (pCVar4 != (Context *)0x0) {
    (*(code *)pCVar4->m_testCtx->m_rootArchive)();
    this[10].super_TestInstance.m_context = (Context *)0x0;
  }
  pvVar5 = (void *)this[9].m_testCase.range;
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,(long)this[10].super_TestInstance._vptr_TestInstance - (long)pvVar5);
  }
  VVar2.m_internal = (deUint64)this[9].super_TestInstance._vptr_TestInstance;
  if (VVar2.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)8>_> *)&this[9].super_TestInstance.m_context,
               VVar2);
  }
  *(undefined8 *)&this[9].m_testCase = 0;
  this[9].m_testCase.offset = 0;
  this[9].super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
  this[9].super_TestInstance.m_context = (Context *)0x0;
  if (*(deUint64 *)&this[8].m_testCase != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)14>_> *)&this[8].m_testCase.offset,
               (VkShaderModule)*(deUint64 *)&this[8].m_testCase);
  }
  this[8].m_testCase.range = 0;
  this[8].m_testCase.usage = 0;
  this[8].m_testCase.features = 0;
  *(undefined8 *)&this[8].m_testCase = 0;
  this[8].m_testCase.offset = 0;
  obj_03.m_internal = this[7].m_testCase.range;
  if (obj_03.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)14>_> *)&this[7].m_testCase.usage,obj_03);
  }
  this[8].super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
  this[8].super_TestInstance.m_context = (Context *)0x0;
  this[7].m_testCase.range = 0;
  this[7].m_testCase.usage = 0;
  this[7].m_testCase.features = 0;
  obj_04.m_internal = (deUint64)this[7].super_TestInstance._vptr_TestInstance;
  if (obj_04.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)12>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)12>_> *)&this[7].super_TestInstance.m_context,
               obj_04);
  }
  *(undefined8 *)&this[7].m_testCase = 0;
  this[7].m_testCase.offset = 0;
  this[7].super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
  this[7].super_TestInstance.m_context = (Context *)0x0;
  plVar1 = (long *)this[6].m_testCase.range;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
    this[6].m_testCase.range = 0;
  }
  VVar2.m_internal = (deUint64)this[6].super_TestInstance._vptr_TestInstance;
  if (VVar2.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)8>_> *)&this[6].super_TestInstance.m_context,
               VVar2);
  }
  *(undefined8 *)&this[6].m_testCase = 0;
  this[6].m_testCase.offset = 0;
  this[6].super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
  this[6].super_TestInstance.m_context = (Context *)0x0;
  if (*(long *)&this[5].m_testCase != 0) {
    plVar1 = (long *)this[5].m_testCase.offset;
    uVar6._0_4_ = this[5].m_testCase.usage;
    uVar6._4_4_ = this[5].m_testCase.features;
    (**(code **)(*plVar1 + 0x1e8))(plVar1,this[5].m_testCase.range,uVar6,1);
  }
  this[5].m_testCase.range = 0;
  this[5].m_testCase.usage = 0;
  this[5].m_testCase.features = 0;
  *(undefined8 *)&this[5].m_testCase = 0;
  this[5].m_testCase.offset = 0;
  obj_05.m_internal = this[4].m_testCase.range;
  if (obj_05.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)21>_> *)&this[4].m_testCase.usage,obj_05);
  }
  this[5].super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
  this[5].super_TestInstance.m_context = (Context *)0x0;
  this[4].m_testCase.range = 0;
  this[4].m_testCase.usage = 0;
  this[4].m_testCase.features = 0;
  obj_06.m_internal = (deUint64)this[4].super_TestInstance._vptr_TestInstance;
  if (obj_06.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)19>_> *)&this[4].super_TestInstance.m_context,
               obj_06);
  }
  *(undefined8 *)&this[4].m_testCase = 0;
  this[4].m_testCase.offset = 0;
  this[4].super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
  this[4].super_TestInstance.m_context = (Context *)0x0;
  if (*(deUint64 *)&this[3].m_testCase != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)23>_> *)&this[3].m_testCase.offset,
               (VkFramebuffer)*(deUint64 *)&this[3].m_testCase);
  }
  this[3].m_testCase.range = 0;
  this[3].m_testCase.usage = 0;
  this[3].m_testCase.features = 0;
  *(undefined8 *)&this[3].m_testCase = 0;
  this[3].m_testCase.offset = 0;
  obj_07.m_internal = this[2].m_testCase.range;
  if (obj_07.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)17>_> *)&this[2].m_testCase.usage,obj_07);
  }
  this[3].super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
  this[3].super_TestInstance.m_context = (Context *)0x0;
  this[2].m_testCase.range = 0;
  this[2].m_testCase.usage = 0;
  this[2].m_testCase.features = 0;
  obj_08.m_internal = (deUint64)this[2].super_TestInstance._vptr_TestInstance;
  if (obj_08.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)13>_> *)&this[2].super_TestInstance.m_context,
               obj_08);
  }
  *(undefined8 *)&this[2].m_testCase = 0;
  this[2].m_testCase.offset = 0;
  this[2].super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
  this[2].super_TestInstance.m_context = (Context *)0x0;
  plVar1 = (long *)this[1].m_testCase.range;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
    this[1].m_testCase.range = 0;
  }
  obj_09.m_internal = (deUint64)this[1].super_TestInstance._vptr_TestInstance;
  if (obj_09.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)9>_> *)&this[1].super_TestInstance.m_context,
               obj_09);
  }
  *(undefined8 *)&this[1].m_testCase = 0;
  this[1].m_testCase.offset = 0;
  this[1].super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
  this[1].super_TestInstance.m_context = (Context *)0x0;
  return;
}

Assistant:

BufferViewTestInstance::~BufferViewTestInstance	(void)
{
}